

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fraction.cpp
# Opt level: O3

Fraction * __thiscall
Fraction::operator+(Fraction *__return_storage_ptr__,Fraction *this,Fraction *b)

{
  Fraction a;
  BigInteger local_c0;
  BigInteger local_a0;
  BigInteger local_80;
  Fraction local_60;
  
  Fraction(&local_60,this);
  Fraction(__return_storage_ptr__);
  BigIntegerLibrary::BigInteger::operator*(&local_c0,&local_60.denominator,&b->denominator);
  BigIntegerLibrary::BigInteger::operator=(&__return_storage_ptr__->denominator,&local_c0);
  if (local_c0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BigIntegerLibrary::BigInteger::operator*(&local_80,&local_60.numerator,&b->denominator);
  BigIntegerLibrary::BigInteger::operator*(&local_a0,&b->numerator,&local_60.denominator);
  BigIntegerLibrary::BigInteger::operator+(&local_c0,&local_80,&local_a0);
  BigIntegerLibrary::BigInteger::operator=(&__return_storage_ptr__->numerator,&local_c0);
  if (local_c0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  reduction(__return_storage_ptr__);
  if (local_60.denominator.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.denominator.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.denominator.num.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.denominator.num.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.numerator.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.numerator.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.numerator.num.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.numerator.num.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Fraction Fraction::operator+(const Fraction& b) const { // a/b + c/d = (ad+cb)/bd
    Fraction a = *this;
    Fraction c;
    c.denominator = a.denominator * b.denominator;
    c.numerator = a.numerator * b.denominator + b.numerator * a.denominator;
    reduction(c);
    return c;
}